

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,StringPtr *params)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  char *__s1;
  undefined8 *in_R8;
  Maybe<unsigned_long> MVar6;
  Iterator iter;
  Iterator local_60;
  size_t local_48;
  StringPtr *local_40;
  SearchKey local_38;
  StringPtr *local_30;
  size_t *local_28;
  
  local_48 = table.size_;
  local_30 = table.ptr;
  local_28 = &local_48;
  local_38._vptr_SearchKey = (_func_int **)&PTR_search_001c1090;
  local_40 = params;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)&(local_30->content).size_,&local_38);
  uVar3 = (ulong)local_60.row;
  aVar5 = extraout_RDX;
  if ((uVar3 != 0xe) && ((local_60.leaf)->rows[uVar3].i != 0)) {
    uVar3 = (ulong)((local_60.leaf)->rows[uVar3].i - 1);
    lVar4 = uVar3 * 0x20;
    lVar1 = *(long *)(local_48 + 8 + lVar4);
    aVar5.value = lVar1 + (ulong)(lVar1 == 0);
    if (aVar5.value == in_R8[1]) {
      if (lVar1 == 0) {
        __s1 = "";
      }
      else {
        __s1 = *(char **)(local_48 + lVar4);
      }
      iVar2 = bcmp(__s1,(void *)*in_R8,aVar5.value - 1);
      aVar5 = extraout_RDX_00;
      if (iVar2 == 0) {
        *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar3;
        goto LAB_0015d35c;
      }
    }
  }
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
LAB_0015d35c:
  MVar6.ptr.field_1.value = aVar5.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return nullptr;
    }
  }